

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

int lj_gc_step_jit(global_State *g,MSize steps)

{
  char cVar1;
  int32_t iVar2;
  int errcode;
  TValue *pTVar3;
  lua_State *L;
  
  iVar2 = g->vmstate;
  L = (lua_State *)(ulong)(g->cur_L).gcptr32;
  pTVar3 = (TValue *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 400);
  L->base = pTVar3;
  L->top = pTVar3 + *(byte *)((ulong)*(uint *)((ulong)pTVar3[-1].u32.lo + 0x10) - 0x39);
  errcode = lj_vm_cpcall(L,0,steps,gc_step_jit_cp);
  g->vmstate = iVar2;
  if (errcode == 0) {
    cVar1 = *(char *)((ulong)(L->glref).ptr32 + 0x59);
    return (int)(cVar1 == '\x05' || cVar1 == '\x02');
  }
  lj_err_throw(L,errcode);
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->cur_L));
  int32_t ostate = g->vmstate;
  int errcode;
  L->base = tvref(G(L)->jit_base);
  L->top = curr_topL(L);
  errcode = lj_vm_cpcall(L, NULL, (void *)(uintptr_t)steps, gc_step_jit_cp);
  g->vmstate = ostate;
  if (errcode)
    lj_err_throw(L, errcode);  /* Propagate errors. */
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}